

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

char * ssh_sftp_get_cmdline(char *prompt,_Bool no_fds_ok)

{
  char *pcVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sStack_38;
  int ret;
  size_t bufsize;
  size_t buflen;
  char *buf;
  char *pcStack_18;
  _Bool no_fds_ok_local;
  char *prompt_local;
  
  buf._7_1_ = no_fds_ok;
  pcStack_18 = prompt;
  fputs(prompt,_stdout);
  fflush(_stdout);
  buflen = 0;
  sStack_38 = 0;
  bufsize = 0;
  do {
    do {
      iVar2 = ssh_sftp_do_select(true,(_Bool)(buf._7_1_ & 1));
      if (iVar2 < 0) {
        printf("connection died\n");
        safefree((void *)buflen);
        return (char *)0x0;
      }
    } while (iVar2 < 1);
    buflen = (size_t)safegrowarray((void *)buflen,&stack0xffffffffffffffc8,1,bufsize,1,false);
    sVar3 = read(0,(void *)(buflen + bufsize),1);
    if ((int)sVar3 < 0) {
      perror("read");
      safefree((void *)buflen);
      return (char *)0x0;
    }
    if ((int)sVar3 == 0) {
      safefree((void *)buflen);
      return (char *)0x0;
    }
    pcVar1 = (char *)(buflen + bufsize);
    bufsize = bufsize + 1;
  } while (*pcVar1 != '\n');
  return (char *)buflen;
}

Assistant:

char *ssh_sftp_get_cmdline(const char *prompt, bool no_fds_ok)
{
    char *buf;
    size_t buflen, bufsize;
    int ret;

    fputs(prompt, stdout);
    fflush(stdout);

    buf = NULL;
    buflen = bufsize = 0;

    while (1) {
        ret = ssh_sftp_do_select(true, no_fds_ok);
        if (ret < 0) {
            printf("connection died\n");
            sfree(buf);
            return NULL;               /* woop woop */
        }
        if (ret > 0) {
            sgrowarray(buf, bufsize, buflen);
            ret = read(0, buf+buflen, 1);
            if (ret < 0) {
                perror("read");
                sfree(buf);
                return NULL;
            }
            if (ret == 0) {
                /* eof on stdin; no error, but no answer either */
                sfree(buf);
                return NULL;
            }

            if (buf[buflen++] == '\n') {
                /* we have a full line */
                return buf;
            }
        }
    }
}